

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,decimal_fp<float> *fp,
          basic_format_specs<char> *specs,float_specs fspecs,char decimal_point)

{
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar1;
  iterator it;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  significand_type sVar8;
  uint uVar9;
  size_t n;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_7_94dcc806 write;
  undefined1 local_81 [5];
  sign_t local_7c;
  int local_78;
  uint local_74;
  decimal_fp<float> local_70;
  undefined1 local_64 [4];
  anon_class_56_7_a2a26a24 local_60;
  
  local_74 = fp->significand;
  uVar9 = 0x1f;
  if ((local_74 | 1) != 0) {
    for (; (local_74 | 1) >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  local_78 = (uint)*(ushort *)(bsr2log10(int)::data + (ulong)uVar9 * 2) -
             (uint)(local_74 <
                   *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                            (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)uVar9 * 2) * 4));
  local_70.exponent = fspecs._4_4_;
  local_7c = (uint)local_70.exponent >> 8 & 0xff;
  uVar5 = (ulong)((uint)(local_7c != none) + local_78);
  uVar9 = fp->exponent;
  sVar8 = uVar9 + local_78;
  local_70.significand = fspecs.precision;
  local_81[0] = decimal_point;
  local_70 = (decimal_fp<float>)fspecs;
  if (fspecs._4_1_ == '\x01') {
LAB_00195ba3:
    iVar2 = uVar9 + local_78 + -1;
    if (((uint)local_70.exponent >> 0x14 & 1) == 0) {
      uVar4 = 0;
      if (local_78 == 1) {
        local_81[0] = '\0';
      }
    }
    else {
      uVar4 = 0;
      if (0 < (int)(local_70.significand - local_78)) {
        uVar4 = (ulong)(local_70.significand - local_78);
      }
      uVar5 = uVar5 + uVar4;
    }
    local_60.sign = (sign_t *)(CONCAT44(local_74,(uint)local_70.exponent >> 8) & 0xffffffff000000ff)
    ;
    local_60.significand._0_5_ = CONCAT14(local_81[0],local_78);
    local_60.significand_size =
         (int *)(CONCAT35(local_60.significand_size._5_3_,
                          CONCAT14((((uint)local_70.exponent >> 0x10 & 1) == 0) << 5,(int)uVar4)) |
                0x4500000000);
    local_60.fp = (decimal_fp<float> *)CONCAT44(local_60.fp._4_4_,iVar2);
    uVar4 = (ulong)specs->width;
    if ((long)uVar4 < 1) {
      bVar1 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
              ::anon_class_28_7_94dcc806::operator()
                        ((anon_class_28_7_94dcc806 *)&local_60,out.container);
      return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar1.container;
    }
    if ((int)sVar8 < 1) {
      iVar2 = 1 - sVar8;
    }
    lVar3 = 2;
    if (99 < iVar2) {
      lVar3 = (ulong)(999 < iVar2) + 3;
    }
    uVar6 = uVar5 + (3 - (ulong)(local_81[0] == '\0')) + lVar3;
    uVar5 = 0;
    if (uVar6 <= uVar4) {
      uVar5 = uVar4 - uVar6;
    }
    uVar4 = uVar5 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                               (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    bVar1 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                      (out,uVar4,&specs->fill);
    it.container = (buffer<char> *)
                   write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
                   ::anon_class_28_7_94dcc806::operator()
                             ((anon_class_28_7_94dcc806 *)&local_60,bVar1.container);
    n = uVar5 - uVar4;
  }
  else {
    if (((ulong)fspecs & 0xff00000000) == 0) {
      uVar7 = 0x10;
      if (0 < (int)local_70.significand) {
        uVar7 = local_70.significand;
      }
      if (((int)sVar8 < -3) || ((int)uVar7 < (int)sVar8)) goto LAB_00195ba3;
    }
    local_64 = (undefined1  [4])sVar8;
    if ((int)uVar9 < 0) {
      if (0 < (int)sVar8) {
        local_81._1_4_ = local_70.significand - local_78 & (local_70.exponent << 0xb) >> 0x1f;
        local_60.decimal_point = local_81 + 1;
        uVar4 = (ulong)(uint)local_81._1_4_;
        if ((int)local_81._1_4_ < 1) {
          uVar4 = 0;
        }
        uVar4 = uVar4 + uVar5 + 1;
        local_60.sign = &local_7c;
        local_60.significand = &local_74;
        local_60.significand_size = &local_78;
        local_60.fp = (decimal_fp<float> *)local_64;
        local_60.fspecs = (float_specs *)local_81;
        uVar5 = 0;
        if (uVar4 <= (uint)specs->width) {
          uVar5 = (uint)specs->width - uVar4;
        }
        uVar4 = uVar5 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                   (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
        bVar1 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                          (out,uVar4,&specs->fill);
        it.container = (buffer<char> *)
                       write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
                       ::anon_class_48_6_48d028d1::operator()
                                 ((anon_class_48_6_48d028d1 *)&local_60,bVar1.container);
        n = uVar5 - uVar4;
        goto LAB_00195d53;
      }
      uVar9 = -sVar8;
      local_60.fp = &local_70;
      local_81._1_4_ = uVar9;
      if (SBORROW4(local_70.significand,uVar9) != (int)(local_70.significand + sVar8) < 0) {
        local_81._1_4_ = local_70.significand;
      }
      if ((int)local_70.significand < 0) {
        local_81._1_4_ = uVar9;
      }
      if (local_78 != 0) {
        local_81._1_4_ = uVar9;
      }
      local_60.significand = (significand_type *)(local_81 + 1);
      uVar5 = (local_81._1_4_ + 2) + uVar5;
      local_60.sign = &local_7c;
      local_60.significand_size = &local_78;
      local_60.fspecs = (float_specs *)local_81;
      local_60.decimal_point = (char *)&local_74;
      uVar4 = 0;
      if (uVar5 <= (uint)specs->width) {
        uVar4 = (uint)specs->width - uVar5;
      }
      uVar5 = uVar4 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                 (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
      bVar1 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                        (out,uVar5,&specs->fill);
      it = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
           ::anon_class_48_6_9afe1116::operator()
                     ((anon_class_48_6_9afe1116 *)&local_60,bVar1.container);
    }
    else {
      uVar5 = uVar5 + uVar9;
      local_81._1_4_ = local_70.significand - sVar8;
      if (((uint)local_70.exponent >> 0x14 & 1) != 0) {
        if ((fspecs._4_1_ != '\x02') && ((int)local_81._1_4_ < 1)) {
          local_81._1_4_ = 1;
        }
        if (0 < (long)(int)local_81._1_4_) {
          uVar5 = uVar5 + (long)(int)local_81._1_4_;
        }
      }
      local_60.sign = &local_7c;
      local_60.significand = &local_74;
      local_60.significand_size = &local_78;
      local_60.fspecs = (float_specs *)&local_70;
      local_60.decimal_point = local_81;
      local_60.num_zeros = (int *)(local_81 + 1);
      uVar4 = 0;
      if (uVar5 <= (uint)specs->width) {
        uVar4 = (uint)specs->width - uVar5;
      }
      uVar5 = uVar4 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                 (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
      local_60.fp = fp;
      bVar1 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                        (out,uVar5,&specs->fill);
      it = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
           ::anon_class_56_7_a2a26a24::operator()(&local_60,bVar1.container);
    }
    n = uVar4 - uVar5;
  }
LAB_00195d53:
  bVar1 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                    (it.container,n,&specs->fill);
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar1.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}